

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yy.c
# Opt level: O2

void yy_lex_common(yy_lex_intern *x,envy_loc *loc,char *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = x->line;
  loc->lstart = iVar1;
  iVar2 = x->pos;
  loc->cstart = iVar2;
  do {
    if (*str == '\n') {
      x->pos = 1;
      iVar1 = iVar1 + 1;
      x->line = iVar1;
      iVar2 = 1;
    }
    else {
      if (*str == '\0') {
        loc->lend = iVar1;
        loc->cend = iVar2;
        loc->file = x->file;
        return;
      }
      iVar2 = iVar2 + 1;
      x->pos = iVar2;
    }
    str = str + 1;
  } while( true );
}

Assistant:

void yy_lex_common(struct yy_lex_intern *x, YYLTYPE *loc, const char *str) {
	int i;
	loc->lstart = x->line;
	loc->cstart = x->pos;
	for (i = 0; str[i]; i++) {
		if (str[i] == '\n') {
			x->pos = 1;
			x->line++;
		} else {
			x->pos++;
		}
	}
	loc->lend = x->line;
	loc->cend = x->pos;
	loc->file = x->file;
}